

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::ComputeContactImpulsesDirect
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  Scalar SVar1;
  Scalar *pSVar2;
  size_t sVar3;
  long in_RCX;
  long in_RDI;
  long index;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this;
  bool in_stack_00000037;
  MatrixNd *in_stack_00000038;
  ConstraintSet *in_stack_00000040;
  VectorNd *in_stack_00000048;
  Model *in_stack_00000050;
  uint i_1;
  uint i;
  VectorNd *in_stack_000002b8;
  VectorNd *in_stack_000002c0;
  VectorNd *in_stack_000002c8;
  Model *in_stack_000002d0;
  MatrixNd *in_stack_000002d8;
  MatrixNd *in_stack_000002e0;
  MatrixNd *in_stack_000002f0;
  VectorNd *in_stack_000002f8;
  VectorNd *in_stack_00000300;
  LinearSolver *in_stack_00000308;
  undefined1 in_stack_000005ff;
  MatrixNd *in_stack_00000600;
  VectorNd *in_stack_00000608;
  Model *in_stack_00000610;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_ffffffffffffff38;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff40;
  undefined4 local_6c;
  undefined4 local_68;
  
  UpdateKinematicsCustom(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8);
  CompositeRigidBodyAlgorithm
            (in_stack_00000610,in_stack_00000608,in_stack_00000600,(bool)in_stack_000005ff);
  CalcContactJacobian(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                      in_stack_00000037);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_ffffffffffffff40,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff38);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  index = in_RCX + 0xf8;
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(in_RCX + 0x110);
  SolveContactSystemDirect
            (in_stack_000002e0,in_stack_000002d8,(VectorNd *)in_stack_000002d0,in_stack_000002c8,
             in_stack_000002c0,in_stack_000002b8,in_stack_000002f0,in_stack_000002f8,
             in_stack_00000300,in_stack_00000308);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x14e9cd);
  for (local_68 = 0; local_68 < *(uint *)(in_RDI + 0x48); local_68 = local_68 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    SVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    *pSVar2 = SVar1;
  }
  local_6c = 0;
  while( true ) {
    sVar3 = ConstraintSet::size((ConstraintSet *)0x14ea72);
    if (sVar3 <= local_6c) break;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    SVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    *pSVar2 = SVar1;
    local_6c = local_6c + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeContactImpulsesDirect (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDotMinus,
		ConstraintSet &CS,
		Math::VectorNd &QDotPlus
		) {
	// Compute H
	UpdateKinematicsCustom (model, &Q, NULL, NULL);
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	CalcContactJacobian (model, Q, CS, CS.G, false);

	SolveContactSystemDirect (CS.H, CS.G, CS.H * QDotMinus, CS.v_plus, QDotPlus, CS.impulse, CS.A, CS.b, CS.x, CS.linear_solver);

	// Copy back QDotPlus
	for (unsigned int i = 0; i < model.dof_count; i++)
		QDotPlus[i] = CS.x[i];

	// Copy back constraint impulses 
	for (unsigned int i = 0; i < CS.size(); i++) {
		CS.impulse[i] = CS.x[model.dof_count + i];
	}
}